

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

void gen_VNMLA_dp(TCGContext_conflict1 *tcg_ctx,TCGv_i64 vd,TCGv_i64 vn,TCGv_i64 vm,TCGv_ptr fpst)

{
  TCGTemp *ret;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  TCGTemp *ret_00;
  TCGTemp *args [1];
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_ptr local_38;
  
  ret = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  local_48 = (TCGTemp *)(vn + (long)tcg_ctx);
  local_40 = (TCGTemp *)(vm + (long)tcg_ctx);
  local_38 = fpst + (long)tcg_ctx;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_muld_aarch64,ret,3,&local_48);
  local_48 = ret;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_negd_aarch64,ret,1,&local_48);
  ret_00 = (TCGTemp *)(vd + (long)tcg_ctx);
  local_48 = ret_00;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_negd_aarch64,ret_00,1,&local_48);
  local_48 = ret_00;
  local_40 = ret;
  local_38 = fpst + (long)tcg_ctx;
  tcg_gen_callN_aarch64(tcg_ctx,helper_vfp_addd_aarch64,ret_00,3,&local_48);
  tcg_temp_free_internal_aarch64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_VNMLA_dp(TCGContext *tcg_ctx, TCGv_i64 vd, TCGv_i64 vn, TCGv_i64 vm, TCGv_ptr fpst)
{
    /* VNMLA: -fd + (fn * fm) */
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);

    gen_helper_vfp_muld(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_negd(tcg_ctx, tmp, tmp);
    gen_helper_vfp_negd(tcg_ctx, vd, vd);
    gen_helper_vfp_addd(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i64(tcg_ctx, tmp);
}